

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O0

QPlatformMenu * __thiscall QMenuPrivate::createPlatformMenu(QMenuPrivate *this)

{
  bool bVar1;
  QMenu *this_00;
  QPlatformTheme *pQVar2;
  QPlatformMenu *pQVar3;
  QMenuPrivate *in_RDI;
  QMenu *q;
  QPlatformMenu *in_stack_ffffffffffffffd8;
  
  this_00 = q_func(in_RDI);
  bVar1 = QPointer<QPlatformMenu>::isNull((QPointer<QPlatformMenu> *)0x63e912);
  if (bVar1) {
    pQVar2 = QGuiApplicationPrivate::platformTheme();
    (**(code **)(*(long *)pQVar2 + 0x18))();
    QMenu::setPlatformMenu(this_00,in_stack_ffffffffffffffd8);
  }
  pQVar3 = QPointer<QPlatformMenu>::data((QPointer<QPlatformMenu> *)0x63e94e);
  return pQVar3;
}

Assistant:

QPlatformMenu *QMenuPrivate::createPlatformMenu()
{
    Q_Q(QMenu);
    if (platformMenu.isNull())
        q->setPlatformMenu(QGuiApplicationPrivate::platformTheme()->createPlatformMenu());
    return platformMenu.data();
}